

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O3

void __thiscall
Centaurus::CharClass<char>::CharClass(CharClass<char> *this,wchar_t start,wchar_t end)

{
  Range<char> local_20;
  
  this->_vptr_CharClass = (_func_int **)&PTR__CharClass_0019a258;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_20._vptr_Range = (_func_int **)&PTR__Range_0019a288;
  local_20.m_start = (char)start;
  local_20.m_end = (char)end;
  std::vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>>::
  emplace_back<Centaurus::Range<char>>
            ((vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>> *)
             &this->m_ranges,&local_20);
  return;
}

Assistant:

CharClass(wchar_t start, wchar_t end)
    {
        m_ranges.push_back(Range<TCHAR>::make_from_wide(start, end));
    }